

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O2

uint Assimp::strtoul8(char *in,char **out)

{
  uint value;
  
  value = 0;
  for (; 0xf7 < (byte)(*in - 0x38U); in = in + 1) {
    value = (uint)(byte)(*in - 0x30) + value * 8;
  }
  if (out != (char **)0x0) {
    *out = in;
  }
  return value;
}

Assistant:

inline
unsigned int strtoul8( const char* in, const char** out=0) {
    unsigned int value( 0 );
    for ( ;; ) {
        if ( *in < '0' || *in > '7' ) {
            break;
        }

        value = ( value << 3 ) + ( *in - '0' );
        ++in;
    }
    if ( out ) {
        *out = in;
    }
    return value;
}